

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O3

int __thiscall
TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::ClassId
          (TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZSpStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZStructMatrixT<double>::ClassId(&this->super_TPZStructMatrixT<double>);
  iVar3 = TPZStructMatrixOR<double>::ClassId
                    ((TPZStructMatrixOR<double> *)
                     &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSpStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZSpStructMatrix") ^
        TPZStructMatrixT<TVar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}